

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

void __thiscall
Json::OurReader::addComment(OurReader *this,Location begin,Location end,CommentPlacement placement)

{
  undefined4 in_register_0000000c;
  string local_30;
  
  if (this->collectComments_ == false) {
    __assert_fail("collectComments_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/lib_json/json_reader.cpp"
                  ,0x528,"void Json::OurReader::addComment(Location, Location, CommentPlacement)");
  }
  normalizeEOL_abi_cxx11_
            (&local_30,(Json *)begin,end,(Location)CONCAT44(in_register_0000000c,placement));
  if (placement == commentAfterOnSameLine) {
    if (this->lastValue_ == (Value *)0x0) {
      __assert_fail("lastValue_ != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/lib_json/json_reader.cpp"
                    ,0x52b,"void Json::OurReader::addComment(Location, Location, CommentPlacement)")
      ;
    }
    Value::setComment(this->lastValue_,&local_30,commentAfterOnSameLine);
  }
  else {
    std::__cxx11::string::_M_append((char *)&this->commentsBefore_,(ulong)local_30._M_dataplus._M_p)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void
OurReader::addComment(Location begin, Location end, CommentPlacement placement) {
  assert(collectComments_);
  const std::string& normalized = normalizeEOL(begin, end);
  if (placement == commentAfterOnSameLine) {
    assert(lastValue_ != 0);
    lastValue_->setComment(normalized, placement);
  } else {
    commentsBefore_ += normalized;
  }
}